

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMakeModule::set_module_name(CTcMakeModule *this,textchar_t *modname)

{
  int iVar1;
  char *in_RDI;
  textchar_t buf [4096];
  char *in_stack_ffffffffffffefd8;
  textchar_t *in_stack_ffffffffffffefe8;
  CTcMakeStr *in_stack_ffffffffffffeff0;
  size_t in_stack_ffffffffffffeff8;
  char *in_stack_fffffffffffff000;
  
  iVar1 = CTcMakeStr::is_set((CTcMakeStr *)(in_RDI + 8));
  if (iVar1 == 0) {
    lib_strcpy(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0
              );
    os_defext((char *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
    CTcMakeStr::set(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  }
  iVar1 = CTcMakeStr::is_set((CTcMakeStr *)(in_RDI + 0x28));
  if (iVar1 == 0) {
    lib_strcpy(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0
              );
    os_remext(in_RDI);
    os_addext(in_RDI,in_stack_ffffffffffffefd8);
    CTcMakeStr::set(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  }
  iVar1 = CTcMakeStr::is_set((CTcMakeStr *)(in_RDI + 0x30));
  if (iVar1 == 0) {
    lib_strcpy(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8,(char *)in_stack_ffffffffffffeff0
              );
    os_remext(in_RDI);
    os_addext(in_RDI,in_stack_ffffffffffffefd8);
    CTcMakeStr::set(in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
  }
  return;
}

Assistant:

void CTcMakeModule::set_module_name(const textchar_t *modname)
{
    textchar_t buf[OSFNMAX];

    /* set the source name, if it's not already set */
    if (!src_.is_set())
    {
        /* add a default extension of ".t" to make the source name */
        lib_strcpy(buf, sizeof(buf), modname);
        os_defext(buf, "t");
        src_.set(buf);
    }

    /* set the symbol file name, if it's not already set */
    if (!sym_.is_set())
    {
        /* add a default extension of ".t3s" to make the symbol file name */
        lib_strcpy(buf, sizeof(buf), modname);
        os_remext(buf);
        os_addext(buf, "t3s");
        sym_.set(buf);
    }

    /* set the object file name, if it's not already set */
    if (!obj_.is_set())
    {
        /* add a default extension of ".t3o" to make the object name */
        lib_strcpy(buf, sizeof(buf), modname);
        os_remext(buf);
        os_addext(buf, "t3o");
        obj_.set(buf);
    }
}